

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Customer.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
AlchoholicCustomer::order
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,AlchoholicCustomer *this,
          vector<Dish,_std::allocator<Dish>_> *menu)

{
  int *__args;
  pointer pDVar1;
  int iVar2;
  DishType DVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  uint uVar7;
  iterator iVar8;
  ulong uVar9;
  int local_38;
  int local_34;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->minInx != this->maxInx) {
    uVar7 = (int)((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 4) * -0x55555555;
    __args = &this->minInx;
    if (this->ordered == false) {
      if (0 < (int)uVar7) {
        puVar6 = (undefined8 *)0x0;
        uVar9 = 0;
        do {
          pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                  -0x5555555555555555;
          if (uVar5 < uVar9 || uVar5 - uVar9 == 0) {
LAB_0010897c:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar9);
            goto LAB_0010898d;
          }
          DVar3 = Dish::getType((Dish *)((long)&pDVar1->id + (long)puVar6));
          if (DVar3 == ALC) {
            pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                    -0x5555555555555555;
            if (uVar5 < uVar9 || uVar5 - uVar9 == 0) goto LAB_0010897c;
            iVar2 = Dish::getPrice((Dish *)((long)&pDVar1->id + (long)puVar6));
            if (iVar2 < this->minAlc) {
              pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                      -0x5555555555555555;
              if (uVar5 < uVar9 || uVar5 - uVar9 == 0) goto LAB_0010897c;
              iVar2 = Dish::getPrice((Dish *)((long)&pDVar1->id + (long)puVar6));
              this->minAlc = iVar2;
              this->minInx = (int)uVar9;
            }
          }
          pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                  -0x5555555555555555;
          if (uVar5 < uVar9 || uVar5 - uVar9 == 0) goto LAB_0010897c;
          DVar3 = Dish::getType((Dish *)((long)&pDVar1->id + (long)puVar6));
          if (DVar3 == ALC) {
            pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                    -0x5555555555555555;
            if (uVar5 < uVar9 || uVar5 - uVar9 == 0) goto LAB_0010897c;
            iVar2 = Dish::getPrice((Dish *)((long)&pDVar1->id + (long)puVar6));
            if (*(int *)&(this->super_Customer).field_0x2c <= iVar2) {
              pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                      -0x5555555555555555;
              if (uVar5 < uVar9 || uVar5 - uVar9 == 0) goto LAB_0010897c;
              iVar2 = Dish::getPrice((Dish *)((long)&pDVar1->id + (long)puVar6));
              *(int *)&(this->super_Customer).field_0x2c = iVar2;
              this->maxInx = (int)uVar9;
            }
          }
          uVar9 = uVar9 + 1;
          puVar6 = puVar6 + 6;
        } while ((uVar7 & 0x7fffffff) != uVar9);
      }
      if (this->minAlc < 0x7f) {
        iVar8._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar8,__args);
        }
        else {
          *iVar8._M_current = *__args;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        this->ordered = true;
      }
      else {
        this->ordered = true;
      }
    }
    else if ((int)uVar7 < 1) {
      this->minAlc = 0x7f;
      this->minInx = 0x7f;
    }
    else {
      local_38 = 0x7f;
      puVar6 = (undefined8 *)0x0;
      uVar9 = 0;
      local_34 = 0x7f;
      do {
        pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) * -0x5555555555555555;
        if (uVar5 < uVar9 || uVar5 - uVar9 == 0) {
LAB_0010898d:
          uVar4 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar9);
          if ((void *)*puVar6 != (void *)0x0) {
            operator_delete((void *)*puVar6);
          }
          _Unwind_Resume(uVar4);
        }
        iVar2 = Dish::getPrice((Dish *)((long)&pDVar1->id + (long)puVar6));
        if (this->minAlc <= iVar2) {
          pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                  -0x5555555555555555;
          if (uVar5 < uVar9 || uVar5 - uVar9 == 0) goto LAB_0010898d;
          DVar3 = Dish::getType((Dish *)((long)&pDVar1->id + (long)puVar6));
          if (DVar3 == ALC) {
            pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                    -0x5555555555555555;
            if (uVar5 < uVar9 || uVar5 - uVar9 == 0) goto LAB_0010898d;
            iVar2 = Dish::getPrice((Dish *)((long)&pDVar1->id + (long)puVar6));
            if ((iVar2 == this->minAlc) && ((long)this->minInx < (long)uVar9)) {
              *__args = (int)uVar9;
              pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                      -0x5555555555555555;
              if (uVar5 < uVar9 || uVar5 - uVar9 == 0) goto LAB_0010898d;
              iVar2 = Dish::getPrice((Dish *)((long)&pDVar1->id + (long)puVar6));
              this->minAlc = iVar2;
              iVar8._M_current =
                   (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar8._M_current ==
                  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar8,__args);
                return __return_storage_ptr__;
              }
              *iVar8._M_current = *__args;
              goto LAB_0010894d;
            }
            pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                    -0x5555555555555555;
            if (uVar5 < uVar9 || uVar5 - uVar9 == 0) goto LAB_0010898d;
            iVar2 = Dish::getPrice((Dish *)((long)&pDVar1->id + (long)puVar6));
            if (this->minAlc < iVar2) {
              pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                      -0x5555555555555555;
              if (uVar5 < uVar9 || uVar5 - uVar9 == 0) goto LAB_0010898d;
              iVar2 = Dish::getPrice((Dish *)((long)&pDVar1->id + (long)puVar6));
              if (iVar2 < local_38) {
                pDVar1 = (menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                uVar5 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pDVar1 >> 4) *
                        -0x5555555555555555;
                if (uVar5 < uVar9 || uVar5 - uVar9 == 0) goto LAB_0010898d;
                local_38 = Dish::getPrice((Dish *)((long)&pDVar1->id + (long)puVar6));
                local_34 = (int)uVar9;
              }
            }
          }
        }
        uVar9 = uVar9 + 1;
        puVar6 = puVar6 + 6;
      } while ((uVar7 & 0x7fffffff) != uVar9);
      this->minInx = local_34;
      this->minAlc = local_38;
      if (local_34 != 0x7f) {
        iVar8._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar8,__args);
        }
        else {
          *iVar8._M_current = local_34;
LAB_0010894d:
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>  AlchoholicCustomer::order(const std::vector<Dish> &menu)
{
    int lastChecked = INT8_MAX;
    int lastCheckedIndex = INT8_MAX;
    std::vector<int> newOrder;
    int size = menu.size();
    if(minInx == maxInx)
        return newOrder;
    if(!ordered)
    {
        for (int i = 0; i < size; ++i)
        {
            if (menu.at(static_cast<unsigned long>(i)).getType() == ALC && menu.at(
                    static_cast<unsigned long>(i)).getPrice() < minAlc)
            {
                minAlc = menu.at(static_cast<unsigned long>(i)).getPrice();
                minInx = i;
            }

            if(menu.at(static_cast<unsigned long>(i)).getType() == ALC && menu.at(
                    static_cast<unsigned long>(i)).getPrice() >= maxAlc)
            {
                maxAlc = menu.at(static_cast<unsigned long>(i)).getPrice();
                maxInx = i;
            }
        }

        if(minAlc < INT8_MAX)
        {
            newOrder.push_back(minInx);
            ordered = true;
            return newOrder;
        }
        ordered = true;
        return newOrder;
    }
    for (int i = 0; i < size; ++i)
    {
        if(menu.at(static_cast<unsigned long>(i)).getPrice() >= minAlc && menu.at(
                static_cast<unsigned long>(i)).getType() == ALC)
        {
            if(menu.at(static_cast<unsigned long>(i)).getPrice() == minAlc && minInx < i)// && !changed
            {
                minInx = i;
                minAlc = menu.at(static_cast<unsigned long>(i)).getPrice();
                newOrder.push_back(minInx);
                return newOrder;
            }
            else if(menu.at(static_cast<unsigned long>(i)).getPrice() > minAlc && menu.at(
                    static_cast<unsigned long>(i)).getPrice() < lastChecked)
            {
                lastChecked = menu.at(static_cast<unsigned long>(i)).getPrice();
                lastCheckedIndex = i;
            }
        }
    }
    minInx = lastCheckedIndex;
    minAlc = lastChecked;
    if(minInx != INT8_MAX)
        newOrder.push_back(minInx);
    return newOrder;
}